

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PanAndZoomWidget.cpp
# Opt level: O1

void __thiscall PanAndZoomWidget::ResetView(PanAndZoomWidget *this)

{
  SetRotation(this,this->rotation_ - this->rotation_);
  ResetTranslation(this);
  this->scale_ = 1.0;
  onScaleUpdated(this,1.0);
  QWidget::update();
  return;
}

Assistant:

void PanAndZoomWidget::ResetView()
{
    ResetRotation();
    ResetTranslation();
    ResetScale();
}